

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuEither.hpp
# Opt level: O0

void __thiscall
tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>::release
          (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
           *this)

{
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *this_local
  ;
  
  this->m_isFirst = true;
  (this->field_1).m_first = (uint *)0x0;
  return;
}

Assistant:

void Either<First, Second>::release (void)
{
	if (m_isFirst)
		m_first->~First();
	else
		m_second->~Second();

	m_isFirst	= true;
	m_first		= DE_NULL;
}